

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O3

long __thiscall
gl4cts::anon_unknown_0::AdvancedIndirectAddressingCase2::Run(AdvancedIndirectAddressingCase2 *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  GLint GVar3;
  string *vs;
  undefined1 *data_00;
  GLuint i;
  long lVar4;
  long lVar5;
  float data [4] [2];
  vec3 local_a8;
  vec3 local_98;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined1 local_68 [8];
  size_type sStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  bVar1 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,4)
  ;
  lVar5 = 0x10;
  if (bVar1) {
    local_68 = (undefined1  [8])&local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,
               "\nlayout(location = 1) in vec2 g_in_position;\nlayout(binding = 0, std430) buffer Transform {\n  vec2 translation;\n} g_transform[4];\nuniform uint g_transform_id = 2;\nvoid main() {\n  gl_Position = vec4(g_in_position + g_transform[g_transform_id].translation, 0, 1);\n}"
               ,"");
    local_88._0_8_ = &local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,
               "\nlayout(location = 0) out vec4 g_fs_out;\nlayout(binding = 4, std430) buffer Material {\n  vec3 color;\n} g_material[4];\nuniform int g_material_id = 1;\nvoid main() {\n  g_fs_out = vec4(g_material[g_material_id].color, 1);\n}"
               ,"");
    vs = (string *)local_68;
    GVar2 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,vs,(string *)local_88);
    this->m_program = GVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._0_8_ != &local_78) {
      operator_delete((void *)local_88._0_8_,local_78._M_allocated_capacity + 1);
    }
    if (local_68 != (undefined1  [8])&local_58) {
      operator_delete((void *)local_68,local_58._M_allocated_capacity + 1);
    }
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
    bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    lVar5 = -1;
    if (bVar1) {
      glu::CallLogWrapper::glGenBuffers(this_00,8,this->m_storage_buffer);
      local_58._M_allocated_capacity = 0x3f000000bf000000;
      local_58._8_8_ = &DAT_3f0000003f000000;
      local_68 = (undefined1  [8])0xbf000000bf000000;
      sStack_60 = 0xbf0000003f000000;
      lVar4 = 0;
      do {
        glu::CallLogWrapper::glBindBufferBase
                  (this_00,0x90d2,(GLuint)lVar4,this->m_storage_buffer[lVar4]);
        glu::CallLogWrapper::glBufferData(this_00,0x90d2,8,vs,0x88e8);
        lVar4 = lVar4 + 1;
        vs = (string *)&vs->_M_string_length;
      } while (lVar4 != 4);
      data_00 = local_68;
      sStack_60 = 0;
      local_58._8_8_ = 0;
      local_48 = 0;
      uStack_30 = 0;
      local_68 = (undefined1  [8])0x3f800000;
      local_58._M_allocated_capacity = 0x3f80000000000000;
      uStack_40 = 0x3f800000;
      local_38 = 0x3f8000003f800000;
      lVar4 = 0xf;
      do {
        glu::CallLogWrapper::glBindBufferBase
                  (this_00,0x90d2,(int)lVar4 - 0xb,this->m_storage_buffer[lVar4 + -0xb]);
        glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,data_00,0x88e8);
        data_00 = data_00 + 0x10;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x13);
      local_58._M_allocated_capacity = 0x3ecccccdbecccccd;
      local_58._8_8_ = 0x3ecccccd3ecccccd;
      local_68 = (undefined1  [8])0xbecccccdbecccccd;
      sStack_60 = 0xbecccccd3ecccccd;
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_vertex_buffer);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x8892,0x20,local_68,0x88e4);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
      glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_rt);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2601);
      glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,0x8058,100,100);
      glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
      glu::CallLogWrapper::glViewport(this_00,0,0,100,100);
      glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->m_fbo);
      glu::CallLogWrapper::glFramebufferTexture(this_00,0x8d40,0x8ce0,this->m_rt,0);
      glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
      glu::CallLogWrapper::glVertexAttribPointer(this_00,1,2,0x1406,'\0',0,(void *)0x0);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
      glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
      glu::CallLogWrapper::glBindVertexArray(this_00,0);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      glu::CallLogWrapper::glClear(this_00,0x4000);
      glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
      sStack_60 = sStack_60 & 0xffffffff00000000;
      local_68 = (undefined1  [8])0x0;
      local_88._8_4_ = 0.0;
      local_88._0_8_ = (pointer)0x0;
      local_98.m_data[2] = 0.0;
      local_98.m_data[0] = 0.0;
      local_98.m_data[1] = 0.0;
      local_a8.m_data[0] = 0.0;
      local_a8.m_data[1] = 1.0;
      local_a8.m_data[2] = 0.0;
      bVar1 = ShaderStorageBufferObjectBase::ValidateWindow4Quads
                        (&this->super_ShaderStorageBufferObjectBase,(vec3 *)local_68,
                         (vec3 *)local_88,&local_98,&local_a8,(int *)0x0);
      if (bVar1) {
        GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_transform_id");
        glu::CallLogWrapper::glUniform1ui(this_00,GVar3,0);
        GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_material_id");
        glu::CallLogWrapper::glUniform1i(this_00,GVar3,2);
        glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
        local_68 = (undefined1  [8])0x0;
        sStack_60._0_4_ = 1.0;
        local_88._8_4_ = 0.0;
        local_88._0_8_ = (pointer)0x0;
        local_98.m_data[2] = 0.0;
        local_98.m_data[0] = 0.0;
        local_98.m_data[1] = 0.0;
        local_a8.m_data[0] = 0.0;
        local_a8.m_data[1] = 1.0;
        local_a8.m_data[2] = 0.0;
        bVar1 = ShaderStorageBufferObjectBase::ValidateWindow4Quads
                          (&this->super_ShaderStorageBufferObjectBase,(vec3 *)local_68,
                           (vec3 *)local_88,&local_98,&local_a8,(int *)0x0);
        if (bVar1) {
          GVar3 = glu::CallLogWrapper::glGetUniformLocation
                            (this_00,this->m_program,"g_transform_id");
          glu::CallLogWrapper::glUniform1ui(this_00,GVar3,1);
          GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_material_id")
          ;
          glu::CallLogWrapper::glUniform1i(this_00,GVar3,3);
          glu::CallLogWrapper::glDrawArraysInstanced(this_00,5,0,4,1);
          local_68 = (undefined1  [8])0x0;
          sStack_60._0_4_ = 1.0;
          local_88._0_8_ = (pointer)0x3f8000003f800000;
          local_88._8_4_ = 0.0;
          local_98.m_data[2] = 0.0;
          local_98.m_data[0] = 0.0;
          local_98.m_data[1] = 0.0;
          local_a8.m_data[0] = 0.0;
          local_a8.m_data[1] = 1.0;
          local_a8.m_data[2] = 0.0;
          bVar1 = ShaderStorageBufferObjectBase::ValidateWindow4Quads
                            (&this->super_ShaderStorageBufferObjectBase,(vec3 *)local_68,
                             (vec3 *)local_88,&local_98,&local_a8,(int *)0x0);
          if (bVar1) {
            GVar3 = glu::CallLogWrapper::glGetUniformLocation
                              (this_00,this->m_program,"g_transform_id");
            glu::CallLogWrapper::glUniform1ui(this_00,GVar3,3);
            GVar3 = glu::CallLogWrapper::glGetUniformLocation
                              (this_00,this->m_program,"g_material_id");
            glu::CallLogWrapper::glUniform1i(this_00,GVar3,0);
            glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
            local_68 = (undefined1  [8])0x0;
            sStack_60._0_4_ = 1.0;
            local_88._0_8_ = (pointer)0x3f8000003f800000;
            local_88._8_4_ = 0.0;
            local_98.m_data[0] = 1.0;
            local_98.m_data[1] = 0.0;
            local_98.m_data[2] = 0.0;
            local_a8.m_data[0] = 0.0;
            local_a8.m_data[1] = 1.0;
            local_a8.m_data[2] = 0.0;
            bVar1 = ShaderStorageBufferObjectBase::ValidateWindow4Quads
                              (&this->super_ShaderStorageBufferObjectBase,(vec3 *)local_68,
                               (vec3 *)local_88,&local_98,&local_a8,(int *)0x0);
            if (bVar1) {
              glu::CallLogWrapper::glClear(this_00,0x4000);
              GVar3 = glu::CallLogWrapper::glGetUniformLocation
                                (this_00,this->m_program,"g_transform_id");
              glu::CallLogWrapper::glUniform1ui(this_00,GVar3,2);
              GVar3 = glu::CallLogWrapper::glGetUniformLocation
                                (this_00,this->m_program,"g_material_id");
              glu::CallLogWrapper::glUniform1i(this_00,GVar3,1);
              glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
              GVar3 = glu::CallLogWrapper::glGetUniformLocation
                                (this_00,this->m_program,"g_transform_id");
              glu::CallLogWrapper::glUniform1ui(this_00,GVar3,0);
              GVar3 = glu::CallLogWrapper::glGetUniformLocation
                                (this_00,this->m_program,"g_material_id");
              glu::CallLogWrapper::glUniform1i(this_00,GVar3,2);
              glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
              GVar3 = glu::CallLogWrapper::glGetUniformLocation
                                (this_00,this->m_program,"g_transform_id");
              glu::CallLogWrapper::glUniform1ui(this_00,GVar3,1);
              GVar3 = glu::CallLogWrapper::glGetUniformLocation
                                (this_00,this->m_program,"g_material_id");
              glu::CallLogWrapper::glUniform1i(this_00,GVar3,3);
              glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
              GVar3 = glu::CallLogWrapper::glGetUniformLocation
                                (this_00,this->m_program,"g_transform_id");
              glu::CallLogWrapper::glUniform1ui(this_00,GVar3,3);
              GVar3 = glu::CallLogWrapper::glGetUniformLocation
                                (this_00,this->m_program,"g_material_id");
              glu::CallLogWrapper::glUniform1i(this_00,GVar3,0);
              glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,4,this->m_storage_buffer[7]);
              glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
              local_68 = (undefined1  [8])0x0;
              sStack_60 = CONCAT44(sStack_60._4_4_,0x3f800000);
              local_88._0_8_ = (pointer)0x3f8000003f800000;
              local_88._8_4_ = 0.0;
              local_98.m_data[0] = 1.0;
              local_98.m_data[1] = 1.0;
              local_98.m_data[2] = 0.0;
              local_a8.m_data[0] = 0.0;
              local_a8.m_data[1] = 1.0;
              local_a8.m_data[2] = 0.0;
              bVar1 = ShaderStorageBufferObjectBase::ValidateWindow4Quads
                                (&this->super_ShaderStorageBufferObjectBase,(vec3 *)local_68,
                                 (vec3 *)local_88,&local_98,&local_a8,(int *)0x0);
              lVar5 = (ulong)bVar1 - 1;
            }
          }
        }
      }
    }
  }
  return lVar5;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(4))
			return NOT_SUPPORTED;

		const char* const glsl_vs =
			NL "layout(location = 1) in vec2 g_in_position;" NL "layout(binding = 0, std430) buffer Transform {" NL
			   "  vec2 translation;" NL "} g_transform[4];" NL "uniform uint g_transform_id = 2;" NL "void main() {" NL
			   "  gl_Position = vec4(g_in_position + g_transform[g_transform_id].translation, 0, 1);" NL "}";

		const char* const glsl_fs =
			NL "layout(location = 0) out vec4 g_fs_out;" NL "layout(binding = 4, std430) buffer Material {" NL
			   "  vec3 color;" NL "} g_material[4];" NL "uniform int g_material_id = 1;" NL "void main() {" NL
			   "  g_fs_out = vec4(g_material[g_material_id].color, 1);" NL "}";
		m_program = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(8, m_storage_buffer);

		/* transform buffers */
		{
			const float data[4][2] = { { -0.5f, -0.5f }, { 0.5f, -0.5f }, { -0.5f, 0.5f }, { 0.5f, 0.5f } };

			for (GLuint i = 0; i < 4; ++i)
			{
				glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i]);
				glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data[i]), data[i], GL_DYNAMIC_DRAW);
			}
		}
		/* material buffers */
		{
			const float data[4][4] = { { 1.0f, 0.0f, 0.0f, 0.0f },
									   { 0.0f, 1.0f, 0.0f, 0.0f },
									   { 0.0f, 0.0f, 1.0f, 0.0f },
									   { 1.0f, 1.0f, 0.0f, 0.0f } };
			for (GLuint i = 0; i < 4; ++i)
			{
				glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i + 4, m_storage_buffer[i + 4]);
				glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data[i]), data[i], GL_DYNAMIC_DRAW);
			}
		}

		/* vertex buffer */
		{
			const float data[] = { -0.4f, -0.4f, 0.4f, -0.4f, -0.4f, 0.4f, 0.4f, 0.4f };
			glGenBuffers(1, &m_vertex_buffer);
			glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}

		glBindTexture(GL_TEXTURE_2D, m_rt);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
		glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 100, 100);
		glBindTexture(GL_TEXTURE_2D, 0);
		glViewport(0, 0, 100, 100);
		glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
		glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_rt, 0);

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glVertexAttribPointer(1, 2, GL_FLOAT, GL_FALSE, 0, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(1);
		glBindVertexArray(0);

		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);

		glClear(GL_COLOR_BUFFER_BIT);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		if (!ValidateWindow4Quads(vec3(0), vec3(0), vec3(0), vec3(0, 1, 0)))
		{
			return ERROR;
		}

		glUniform1ui(glGetUniformLocation(m_program, "g_transform_id"), 0);
		glUniform1i(glGetUniformLocation(m_program, "g_material_id"), 2);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		if (!ValidateWindow4Quads(vec3(0, 0, 1), vec3(0), vec3(0), vec3(0, 1, 0)))
		{
			return ERROR;
		}

		glUniform1ui(glGetUniformLocation(m_program, "g_transform_id"), 1);
		glUniform1i(glGetUniformLocation(m_program, "g_material_id"), 3);
		glDrawArraysInstanced(GL_TRIANGLE_STRIP, 0, 4, 1);
		if (!ValidateWindow4Quads(vec3(0, 0, 1), vec3(1, 1, 0), vec3(0), vec3(0, 1, 0)))
		{
			return ERROR;
		}

		glUniform1ui(glGetUniformLocation(m_program, "g_transform_id"), 3);
		glUniform1i(glGetUniformLocation(m_program, "g_material_id"), 0);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		if (!ValidateWindow4Quads(vec3(0, 0, 1), vec3(1, 1, 0), vec3(1, 0, 0), vec3(0, 1, 0)))
		{
			return ERROR;
		}

		// once again with only one validation at the end
		glClear(GL_COLOR_BUFFER_BIT);
		glUniform1ui(glGetUniformLocation(m_program, "g_transform_id"), 2);
		glUniform1i(glGetUniformLocation(m_program, "g_material_id"), 1);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		glUniform1ui(glGetUniformLocation(m_program, "g_transform_id"), 0);
		glUniform1i(glGetUniformLocation(m_program, "g_material_id"), 2);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		glUniform1ui(glGetUniformLocation(m_program, "g_transform_id"), 1);
		glUniform1i(glGetUniformLocation(m_program, "g_material_id"), 3);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		glUniform1ui(glGetUniformLocation(m_program, "g_transform_id"), 3);
		glUniform1i(glGetUniformLocation(m_program, "g_material_id"), 0);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 4, m_storage_buffer[7]);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		if (!ValidateWindow4Quads(vec3(0, 0, 1), vec3(1, 1, 0), vec3(1, 1, 0), vec3(0, 1, 0)))
		{
			return ERROR;
		}
		return NO_ERROR;
	}